

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

int __thiscall
lodepng::ExtractZlib::decompress
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in)

{
  byte bVar1;
  byte bVar2;
  size_type sVar3;
  byte *pbVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  long in_RDI;
  unsigned_long FDICT;
  unsigned_long CINFO;
  unsigned_long CM;
  size_t in_stack_00000048;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000050;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000058;
  ExtractZlib *in_stack_00000060;
  undefined4 local_4;
  
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
  if (sVar3 < 2) {
    local_4 = 0x35;
  }
  else {
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDX,0);
    bVar1 = *pbVar4;
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDX,1);
    if (((uint)bVar1 * 0x100 + (uint)*pbVar4) % 0x1f == 0) {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDX,0);
      bVar1 = *pbVar4;
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDX,0);
      bVar2 = *pbVar4;
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDX,1);
      if (((bVar1 & 0xf) == 8) && ((uint)((int)(uint)bVar2 >> 4) < 8)) {
        if (((int)(uint)*pbVar4 >> 5 & 1U) == 0) {
          inflate(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
          local_4 = *(int *)(in_RDI + 8);
        }
        else {
          local_4 = 0x1a;
        }
      }
      else {
        local_4 = 0x19;
      }
    }
    else {
      local_4 = 0x18;
    }
  }
  return local_4;
}

Assistant:

int decompress(std::vector<unsigned char>& out, const std::vector<unsigned char>& in) { //returns error value
    if(in.size() < 2) { return 53; } //error, size of zlib data too small
    //error: 256 * in[0] + in[1] must be a multiple of 31, the FCHECK value is supposed to be made that way
    if((in[0] * 256 + in[1]) % 31 != 0) { return 24; }
    unsigned long CM = in[0] & 15, CINFO = (in[0] >> 4) & 15, FDICT = (in[1] >> 5) & 1;
    //error: only compression method 8: inflate with sliding window of 32k is supported by the PNG spec
    if(CM != 8 || CINFO > 7) { return 25; }
    //error: the PNG spec says about the zlib stream: "The additional flags shall not specify a preset dictionary."
    if(FDICT != 0) { return 26; }
    inflate(out, in, 2);
    return error; //note: adler32 checksum was skipped and ignored
  }